

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O2

bool __thiscall
cmFLTKWrapUICommand::InitialPass
          (cmFLTKWrapUICommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  string *psVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  cmFLTKWrapUICommand *pcVar5;
  bool bVar6;
  string *psVar7;
  string *__x;
  cmSourceFile *this_00;
  size_t classNum;
  long lVar8;
  ulong uVar9;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  cmFLTKWrapUICommand *local_1e0;
  string sourceListValue;
  string varName;
  cmCustomCommandLine commandLine;
  string outputDirectory;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string no_main_dependency;
  string cxxres;
  string cdir;
  cmSourceFile *sf;
  string origname;
  string local_50;
  
  uVar9 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar9 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cdir,"called with incorrect number of arguments",
               (allocator<char> *)&outputDirectory);
    cmCommand::SetError(&this->super_cmCommand,&cdir);
  }
  else {
    psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&cdir,(string *)psVar7);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputDirectory,"FLTK_FLUID_EXECUTABLE",
               (allocator<char> *)&sourceListValue);
    __x = cmMakefile::GetRequiredDefinition(pcVar1,&outputDirectory);
    std::__cxx11::string::~string((string *)&outputDirectory);
    std::__cxx11::string::_M_assign((string *)&this->Target);
    psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&outputDirectory,(string *)psVar7);
    sourceListValue._M_dataplus._M_p = (pointer)0x0;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sourceListValue,&outputDirectory);
    cmMakefile::AddIncludeDirectories
              ((this->super_cmCommand).Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sourceListValue,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sourceListValue);
    psVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_1e0 = this;
LAB_00176ade:
    pcVar5 = local_1e0;
    psVar7 = psVar7 + 1;
    if (psVar7 != psVar2) {
      this_00 = cmMakefile::GetSource((local_1e0->super_cmCommand).Makefile,psVar7,Ambiguous);
      if (this_00 != (cmSourceFile *)0x0) goto LAB_00176b07;
      goto LAB_00176b3f;
    }
    ppcVar3 = (local_1e0->GeneratedSourcesClasses).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppcVar4 = (local_1e0->GeneratedSourcesClasses).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_allocated_capacity =
         sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
    for (lVar8 = 0; (long)ppcVar3 - (long)ppcVar4 >> 3 != lVar8; lVar8 = lVar8 + 1) {
      if (lVar8 != 0) {
        std::__cxx11::string::append((char *)&sourceListValue);
      }
      cmSourceFile::GetFullPath
                ((this->GeneratedSourcesClasses).
                 super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8],(string *)0x0);
      std::__cxx11::string::append((string *)&sourceListValue);
    }
    std::__cxx11::string::string((string *)&varName,(string *)&this->Target);
    std::__cxx11::string::append((char *)&varName);
    cmMakefile::AddDefinition
              ((pcVar5->super_cmCommand).Makefile,&varName,sourceListValue._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&varName);
    std::__cxx11::string::~string((string *)&sourceListValue);
    std::__cxx11::string::~string((string *)&outputDirectory);
  }
  std::__cxx11::string::~string((string *)&cdir);
  return 0x20 < uVar9;
LAB_00176b07:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceListValue,"WRAP_EXCLUDE",(allocator<char> *)&varName);
  bVar6 = cmSourceFile::GetPropertyAsBool(this_00,&sourceListValue);
  std::__cxx11::string::~string((string *)&sourceListValue);
  if (!bVar6) {
LAB_00176b3f:
    std::__cxx11::string::string((string *)&sourceListValue,(string *)&outputDirectory);
    std::__cxx11::string::append((char *)&sourceListValue);
    cmsys::SystemTools::GetFilenameWithoutExtension(&varName,psVar7);
    std::__cxx11::string::append((string *)&sourceListValue);
    std::__cxx11::string::~string((string *)&varName);
    std::__cxx11::string::string((string *)&varName,(string *)&sourceListValue);
    std::__cxx11::string::append((char *)&varName);
    std::operator+(&cxxres,&cdir,"/");
    std::operator+(&origname,&cxxres,psVar7);
    std::__cxx11::string::~string((string *)&cxxres);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,&origname);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,__x);
    std::__cxx11::string::string((string *)&cxxres,(string *)&sourceListValue);
    std::__cxx11::string::append((char *)&cxxres);
    commandLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commandLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commandLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&commandLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,__x);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&no_main_dependency,"-c",(allocator<char> *)&sf);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               &no_main_dependency);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&no_main_dependency,"-h",(allocator<char> *)&sf);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               &no_main_dependency);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commandLine,&varName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&no_main_dependency,"-o",(allocator<char> *)&sf);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               &no_main_dependency);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commandLine,&cxxres);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commandLine,&origname);
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
               ,(value_type *)&commandLine);
    no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
    no_main_dependency._M_string_length = 0;
    no_main_dependency.field_2._M_local_buf[0] = '\0';
    pcVar1 = (local_1e0->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>((string *)&sf,"",&local_1e1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_1e2);
    cmMakefile::AddCustomCommandToOutput
              (pcVar1,&cxxres,&depends,&no_main_dependency,&commandLines,(char *)0x0,(char *)0x0,
               false,true,false,false,(string *)&sf,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&sf);
    pcVar1 = (local_1e0->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>((string *)&sf,"",&local_1e1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_1e2);
    cmMakefile::AddCustomCommandToOutput
              (pcVar1,&varName,&depends,&no_main_dependency,&commandLines,(char *)0x0,(char *)0x0,
               false,true,false,false,(string *)&sf,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&sf);
    sf = cmMakefile::GetSource((local_1e0->super_cmCommand).Makefile,&cxxres,Ambiguous);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&sf->Depends,&varName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&sf->Depends,&origname);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
              (&this->GeneratedSourcesClasses,(value_type *)&sf);
    std::__cxx11::string::~string((string *)&no_main_dependency);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commandLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    std::__cxx11::string::~string((string *)&cxxres);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
    std::__cxx11::string::~string((string *)&origname);
    std::__cxx11::string::~string((string *)&varName);
    std::__cxx11::string::~string((string *)&sourceListValue);
  }
  goto LAB_00176ade;
}

Assistant:

bool cmFLTKWrapUICommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // what is the current source dir
  std::string cdir = this->Makefile->GetCurrentSourceDirectory();
  std::string const& fluid_exe =
    this->Makefile->GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // get parameter for the command
  this->Target = args[0]; // Target that will use the generated files

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = this->Makefile->GetCurrentBinaryDirectory();

  {
    // Some of the generated files are *.h so the directory "GUI"
    // where they are created have to be added to the include path
    std::vector<std::string> outputDirectories;
    outputDirectories.push_back(outputDirectory);
    this->Makefile->AddIncludeDirectories(outputDirectories);
  }

  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    cmSourceFile* curr = this->Makefile->GetSource(arg);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE")) {
      std::string outName = outputDirectory;
      outName += "/";
      outName += cmSystemTools::GetFilenameWithoutExtension(arg);
      std::string hname = outName;
      hname += ".h";
      std::string origname = cdir + "/" + arg;
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = outName;
      cxxres += ".cxx";

      cmCustomCommandLine commandLine;
      commandLine.push_back(fluid_exe);
      commandLine.push_back("-c"); // instructs Fluid to run in command line
      commandLine.push_back("-h"); // optionally rename .h files
      commandLine.push_back(hname);
      commandLine.push_back("-o"); // optionally rename .cxx files
      commandLine.push_back(cxxres);
      commandLine.push_back(origname); // name of the GUI fluid file
      cmCustomCommandLines commandLines;
      commandLines.push_back(commandLine);

      // Add command for generating the .h and .cxx files
      std::string no_main_dependency;
      const char* no_comment = nullptr;
      const char* no_working_dir = nullptr;
      this->Makefile->AddCustomCommandToOutput(
        cxxres, depends, no_main_dependency, commandLines, no_comment,
        no_working_dir);
      this->Makefile->AddCustomCommandToOutput(
        hname, depends, no_main_dependency, commandLines, no_comment,
        no_working_dir);

      cmSourceFile* sf = this->Makefile->GetSource(cxxres);
      sf->AddDepend(hname);
      sf->AddDepend(origname);
      this->GeneratedSourcesClasses.push_back(sf);
    }
  }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = this->GeneratedSourcesClasses.size();
  std::string sourceListValue;
  for (size_t classNum = 0; classNum < lastHeadersClass; classNum++) {
    if (classNum) {
      sourceListValue += ";";
    }
    sourceListValue += this->GeneratedSourcesClasses[classNum]->GetFullPath();
  }
  std::string varName = this->Target;
  varName += "_FLTK_UI_SRCS";
  this->Makefile->AddDefinition(varName, sourceListValue.c_str());

  return true;
}